

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreFree(Gia_ManAre_t *p)

{
  int local_14;
  int i;
  Gia_ManAre_t *p_local;
  
  Gia_ManStop(p->pAig);
  if (p->pNew != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pNew);
  }
  Vec_IntFree(p->vCubesA);
  Vec_IntFree(p->vCubesB);
  Vec_VecFree(p->vCiTfos);
  Vec_VecFree(p->vCiLits);
  for (local_14 = 0; local_14 < p->nObjPages; local_14 = local_14 + 1) {
    if (p->ppObjs[local_14] != (uint *)0x0) {
      free(p->ppObjs[local_14]);
      p->ppObjs[local_14] = (uint *)0x0;
    }
  }
  if (p->ppObjs != (uint **)0x0) {
    free(p->ppObjs);
    p->ppObjs = (uint **)0x0;
  }
  for (local_14 = 0; local_14 < p->nStaPages; local_14 = local_14 + 1) {
    if (p->ppStas[local_14] != (uint *)0x0) {
      free(p->ppStas[local_14]);
      p->ppStas[local_14] = (uint *)0x0;
    }
  }
  if (p->ppStas != (uint **)0x0) {
    free(p->ppStas);
    p->ppStas = (uint **)0x0;
  }
  if (p != (Gia_ManAre_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_ManAreFree( Gia_ManAre_t * p )
{
    int i;
    Gia_ManStop( p->pAig );
    if ( p->pNew )
        Gia_ManStop( p->pNew );
    Vec_IntFree( p->vCubesA );
    Vec_IntFree( p->vCubesB );
    Vec_VecFree( p->vCiTfos );
    Vec_VecFree( p->vCiLits );
    for ( i = 0; i < p->nObjPages; i++ )
        ABC_FREE( p->ppObjs[i] );
    ABC_FREE( p->ppObjs );
    for ( i = 0; i < p->nStaPages; i++ )
        ABC_FREE( p->ppStas[i] );
    ABC_FREE( p->ppStas );
//    ABC_FREE( p->pfUseless );
    ABC_FREE( p );
}